

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_basic_render
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  size_type *psVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *this_00;
  code *pcVar6;
  uint *puVar7;
  long *plVar8;
  _Alloc_hider _Var9;
  LayoutBindingTestResult *pLVar10;
  LayoutBindingTestResult drawTestResult;
  allocator<char> local_322;
  allocator<char> local_321;
  String decl;
  String local_300;
  LayoutBindingTestResult *local_2e0;
  uint local_2d4;
  vector<int,_std::allocator<int>_> bindings;
  long *local_2b8 [2];
  long local_2a8 [2];
  String local_298;
  IProgramContextSupplier *local_278;
  uint *local_270;
  long *local_268 [2];
  long local_258 [2];
  String local_248;
  String local_228;
  String local_208;
  String local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  StringStream s;
  undefined4 extraout_var_01;
  
  std::ios_base::ios_base
            ((ios_base *)
             &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
       glUniformMatrix3x2fv;
  s.super_ostringstream._328_8_ = 0;
  s.super_ostringstream._336_2_ = 0;
  s.super_ostringstream._344_8_ = 0;
  s.super_ostringstream._352_8_ = 0;
  s.super_ostringstream._360_8_ = 0;
  s.super_ostringstream._368_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__StringStream_02143dd0;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
       &PTR__StringStream_02143df8;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&decl,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
            (&drawTestResult,this,&decl);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&s,(char *)drawTestResult._0_8_,
                      (long)drawTestResult.m_reason._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
  psVar1 = &drawTestResult.m_reason._M_string_length;
  if ((size_type *)drawTestResult._0_8_ != psVar1) {
    operator_delete((void *)drawTestResult._0_8_,
                    CONCAT71(drawTestResult.m_reason._M_string_length._1_7_,
                             (undefined1)drawTestResult.m_reason._M_string_length) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decl._M_dataplus._M_p != &decl.field_2) {
    operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  setTemplateParam(this,(this->m_stage).type,"UNIFORM_ACCESS",(String *)&drawTestResult);
  if ((size_type *)drawTestResult._0_8_ != psVar1) {
    operator_delete((void *)drawTestResult._0_8_,
                    CONCAT71(drawTestResult.m_reason._M_string_length._1_7_,
                             (undefined1)drawTestResult.m_reason._M_string_length) + 1);
  }
  local_2e0 = __return_storage_ptr__;
  iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
  makeSparseRange(&bindings,this,iVar4,0);
  if (bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start <
      bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_278 = &this->super_IProgramContextSupplier;
    puVar7 = (uint *)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    do {
      uVar2 = *puVar7;
      local_270 = puVar7;
      iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&drawTestResult,*(char **)CONCAT44(extraout_var,iVar4),&local_321);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
                (&local_300,this,(ulong)uVar2);
      iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,*(char **)(CONCAT44(extraout_var_00,iVar4) + 0x18),&local_322)
      ;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_1c8,this,0)
      ;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                (&local_228,this,local_1c8);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_268,this,0)
      ;
      local_2b8[0] = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"float","");
      local_2d4 = uVar2;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
                (&local_248,this,local_268);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_1e8,this,0);
      local_298._M_string_length = 0;
      local_298.field_2._M_local_buf[0] = '\0';
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      buildUniformDecl(&decl,this,(String *)&drawTestResult,&local_300,&local_208,&local_228,
                       &local_248,&local_1e8,&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                 local_298.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8[0] != local_2a8) {
        operator_delete(local_2b8[0],local_2a8[0] + 1);
      }
      if (local_268[0] != local_258) {
        operator_delete(local_268[0],local_258[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((size_type *)drawTestResult._0_8_ != psVar1) {
        operator_delete((void *)drawTestResult._0_8_,
                        CONCAT71(drawTestResult.m_reason._M_string_length._1_7_,
                                 (undefined1)drawTestResult.m_reason._M_string_length) + 1);
      }
      setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&decl);
      updateTemplate(this,(this->m_stage).type);
      iVar4 = (*local_278->_vptr_IProgramContextSupplier[6])();
      this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar4);
      bVar3 = LayoutBindingProgram::compiledAndLinked(this_00);
      if (!bVar3) {
        LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&drawTestResult,this_00,false);
        pLVar10 = local_2e0;
        local_2e0->m_passed = false;
        local_2e0->m_notRunForThisContext = false;
        (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0->m_reason,drawTestResult._0_8_,
                   drawTestResult.m_reason._M_dataplus._M_p + drawTestResult._0_8_);
        if ((size_type *)drawTestResult._0_8_ != psVar1) {
          drawTestResult.m_reason.field_2._M_allocated_capacity =
               CONCAT71(drawTestResult.m_reason._M_string_length._1_7_,
                        (undefined1)drawTestResult.m_reason._M_string_length);
          _Var9._M_p = (pointer)drawTestResult._0_8_;
LAB_00bda038:
          operator_delete(_Var9._M_p,drawTestResult.m_reason.field_2._M_allocated_capacity + 1);
        }
LAB_00bda040:
        (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)decl._M_dataplus._M_p != &decl.field_2) goto LAB_00bda05d;
        goto LAB_00bda065;
      }
      pcVar6 = (code *)this->m_drawTest;
      plVar8 = (long *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                       *(long *)&this->field_0x88);
      if (((ulong)pcVar6 & 1) != 0) {
        pcVar6 = *(code **)(pcVar6 + *plVar8 + -1);
      }
      (*pcVar6)(&drawTestResult,plVar8,(this_00->m_program->m_program).m_program,local_2d4);
      if (drawTestResult.m_passed == false) {
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_300,drawTestResult.m_reason._M_dataplus._M_p,
                   drawTestResult.m_reason._M_dataplus._M_p +
                   CONCAT71(drawTestResult.m_reason._M_string_length._1_7_,
                            (undefined1)drawTestResult.m_reason._M_string_length));
        pLVar10 = local_2e0;
        local_2e0->m_passed = false;
        local_2e0->m_notRunForThisContext = false;
        (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0->m_reason,local_300._M_dataplus._M_p,
                   local_300._M_dataplus._M_p + local_300._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        _Var9._M_p = drawTestResult.m_reason._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)drawTestResult.m_reason._M_dataplus._M_p != &drawTestResult.m_reason.field_2)
        goto LAB_00bda038;
        goto LAB_00bda040;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)drawTestResult.m_reason._M_dataplus._M_p != &drawTestResult.m_reason.field_2) {
        operator_delete(drawTestResult.m_reason._M_dataplus._M_p,
                        drawTestResult.m_reason.field_2._M_allocated_capacity + 1);
      }
      (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)decl._M_dataplus._M_p != &decl.field_2) {
        operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
      }
      puVar7 = local_270 + 1;
    } while (puVar7 < bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  }
  pLVar10 = local_2e0;
  drawTestResult.m_reason._M_dataplus._M_p = (pointer)0x0;
  drawTestResult.m_reason._M_string_length._0_1_ = 0;
  local_2e0->m_passed = true;
  local_2e0->m_notRunForThisContext = false;
  (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
  drawTestResult._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2e0->m_reason,psVar1,psVar1);
  if ((size_type *)drawTestResult._0_8_ != psVar1) {
    decl.field_2._M_allocated_capacity =
         CONCAT71(drawTestResult.m_reason._M_string_length._1_7_,
                  (undefined1)drawTestResult.m_reason._M_string_length);
    decl._M_dataplus._M_p = (pointer)drawTestResult._0_8_;
LAB_00bda05d:
    operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
  }
LAB_00bda065:
  if (bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  std::ios_base::~ios_base
            ((ios_base *)
             &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  return pLVar10;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_basic_render()
{
	bool passed = true;

	StringStream s;
	s << buildAccess(getDefaultUniformName()) << ";\n";
	setTemplateParam("UNIFORM_ACCESS", s.str());

	std::vector<int> bindings = makeSparseRange(maxBindings());
	for (std::vector<int>::iterator it = bindings.begin(); it < bindings.end(); it++)
	{
		int	binding = *it;
		String decl =
			buildUniformDecl(String(getTestParameters().keyword), buildLayout(binding),
							 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
							 buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog());
		}

		LayoutBindingTestResult drawTestResult = ((*this).*(m_drawTest))(program->getProgram(), binding);
		if (!drawTestResult.testPassed())
		{
			return LayoutBindingTestResult(drawTestResult.testPassed(), drawTestResult.getReason());
		}
	}
	return true;
}